

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

double __thiscall Imath_3_2::Vec2<double>::lengthTiny(Vec2<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = ABS(this->x);
  dVar3 = ABS(this->y);
  dVar4 = dVar3;
  if (dVar3 <= dVar2) {
    dVar4 = dVar2;
  }
  dVar1 = 0.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar1 = SQRT((dVar2 / dVar4) * (dVar2 / dVar4) + (dVar3 / dVar4) * (dVar3 / dVar4)) * dVar4;
  }
  return dVar1;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec2<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = std::abs (x);
    T absY = std::abs (y);

    T max = absX;

    if (max < absY) max = absY;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;

    return max * std::sqrt (absX * absX + absY * absY);
}